

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

ON_MeshCacheItem * __thiscall
ON_MeshCache::Internal_CopyItem(ON_MeshCache *this,ON_MeshCacheItem *src_item)

{
  ON_MeshCacheItem *this_00;
  void *p;
  ON_MeshCacheItem *item;
  ON_MeshCacheItem *src_item_local;
  ON_MeshCache *this_local;
  
  this_00 = (ON_MeshCacheItem *)onmalloc(0x28);
  ON_MeshCacheItem::ON_MeshCacheItem(this_00,src_item);
  this_00->m_next = (ON_MeshCacheItem *)0x0;
  return this_00;
}

Assistant:

class ON_MeshCacheItem* ON_MeshCache::Internal_CopyItem(const class ON_MeshCacheItem& src_item)
{
  // Items must come from the main memory pool to prevent
  // crashing when meshing operations are canceled.
  // Use placement operator new with main heap memory.
  ON_MeshCacheItem* item;
  void* p = onmalloc(sizeof(*item));
  item = new (p) ON_MeshCacheItem(src_item);
  item->m_next = nullptr;
  return item;
}